

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  string local_58;
  ReusableStringStream local_38;
  SourceLineInfo local_20;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    normaliseString(&local_58,this,str);
    uVar4 = (this->m_pattern)._M_string_length;
    if (uVar4 != local_58._M_string_length) goto LAB_00173884;
LAB_001738a7:
    if (uVar4 == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp((this->m_pattern)._M_dataplus._M_p,local_58._M_dataplus._M_p,uVar4);
      bVar5 = iVar2 == 0;
    }
    break;
  case WildcardAtStart:
    normaliseString(&local_58,this,str);
    uVar4 = (this->m_pattern)._M_string_length;
    if (local_58._M_string_length < uVar4) {
      bVar5 = false;
    }
    else if (uVar4 == 0) {
      bVar5 = true;
    }
    else {
      lVar3 = -1;
      do {
        bVar5 = (this->m_pattern)._M_dataplus._M_p[lVar3 + uVar4] ==
                local_58._M_dataplus._M_p[lVar3 + local_58._M_string_length];
        if (!bVar5) break;
        uVar1 = -lVar3;
        lVar3 = lVar3 + -1;
      } while (uVar1 != uVar4);
    }
    goto LAB_0017396c;
  case WildcardAtEnd:
    normaliseString(&local_58,this,str);
    uVar4 = (this->m_pattern)._M_string_length;
    if (uVar4 <= local_58._M_string_length) goto LAB_001738a7;
LAB_00173884:
    bVar5 = false;
    break;
  case WildcardAtBothEnds:
    normaliseString(&local_58,this,str);
    lVar3 = std::__cxx11::string::find
                      ((char *)&local_58,(ulong)(this->m_pattern)._M_dataplus._M_p,0);
    bVar5 = lVar3 != -1;
LAB_0017396c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return bVar5;
    }
    goto LAB_0017397e;
  default:
    ReusableStringStream::ReusableStringStream(&local_38);
    local_20.file =
         "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp";
    local_20.line = 0x3c44;
    operator<<(local_38.m_oss,&local_20);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_38.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_38.m_oss,"Unknown enum",0xc);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
LAB_0017397e:
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }